

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_BorderagentDiscover_Test::~InterpreterTestSuite_PC_BorderagentDiscover_Test
          (InterpreterTestSuite_PC_BorderagentDiscover_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BorderagentDiscover)
{
    TestContext ctx;
    InitContext(ctx);

    BorderAgentFunctionsMock bafm;
    SetBorderAgentFunctionsMock(&bafm);

    EXPECT_CALL(bafm, DiscoverBorderAgent(_, _, _)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("borderagent discover");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    ClearBorderAgentFunctionsMock();
}